

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O0

void __thiscall Funcdata::truncatedFlow(Funcdata *this,Funcdata *fd,FlowInfo *flow)

{
  bool bVar1;
  uintm val;
  int iVar2;
  spacetype sVar3;
  LowlevelError *pLVar4;
  reference ppPVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference ppFVar8;
  PcodeOp *pPVar9;
  SeqNum *pSVar10;
  undefined4 extraout_var;
  Varnode *this_00;
  AddrSpace *this_01;
  reference ppJVar11;
  JumpTable *this_02;
  void *__child_stack;
  void *in_R8;
  undefined1 local_280 [8];
  FlowInfo partialflow;
  JumpTable *jtclone;
  string local_e8 [32];
  PcodeOp *local_c8;
  PcodeOp *newop_1;
  PcodeOp *indop;
  JumpTable **local_b0;
  __normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>
  local_a8;
  const_iterator jiter;
  Varnode *newvn0;
  Varnode *invn0;
  FuncCallSpecs *newspec;
  PcodeOp *newop;
  FuncCallSpecs *oldspec;
  const_iterator cStack_70;
  int4 i;
  _List_node_base *local_68;
  _List_const_iterator<PcodeOp_*> local_60;
  const_iterator oiter;
  allocator local_41;
  string local_40 [32];
  FlowInfo *local_20;
  FlowInfo *flow_local;
  Funcdata *fd_local;
  Funcdata *this_local;
  
  local_20 = flow;
  flow_local = (FlowInfo *)fd;
  fd_local = this;
  bVar1 = PcodeOpBank::empty(&this->obank);
  if (!bVar1) {
    oiter._M_node._3_1_ = 1;
    pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Trying to do truncated flow on pre-existing pcode",&local_41);
    LowlevelError::LowlevelError(pLVar4,(string *)local_40);
    oiter._M_node._3_1_ = 0;
    __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_60);
  local_68 = (_List_node_base *)
             PcodeOpBank::beginDead
                       ((PcodeOpBank *)
                        &flow_local[1].addrlist.
                         super__Vector_base<Address,_std::allocator<Address>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  local_60._M_node = local_68;
  while( true ) {
    cStack_70 = PcodeOpBank::endDead
                          ((PcodeOpBank *)
                           &flow_local[1].addrlist.
                            super__Vector_base<Address,_std::allocator<Address>_>._M_impl.
                            super__Vector_impl_data._M_finish);
    bVar1 = std::operator!=(&local_60,&stack0xffffffffffffff90);
    if (!bVar1) break;
    ppPVar5 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_60);
    pPVar9 = *ppPVar5;
    ppPVar5 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_60);
    pSVar10 = PcodeOp::getSeqNum(*ppPVar5);
    cloneOp(this,pPVar9,pSVar10);
    std::_List_const_iterator<PcodeOp_*>::operator++(&local_60);
  }
  val = PcodeOpBank::getUniqId
                  ((PcodeOpBank *)
                   &flow_local[1].addrlist.super__Vector_base<Address,_std::allocator<Address>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  PcodeOpBank::setUniqId(&this->obank,val);
  for (oldspec._4_4_ = 0; uVar6 = (ulong)oldspec._4_4_,
      sVar7 = std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::size
                        ((vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_> *)
                         &(flow_local->visited)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent), uVar6 < sVar7; oldspec._4_4_ = oldspec._4_4_ + 1) {
    ppFVar8 = std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::operator[]
                        ((vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_> *)
                         &(flow_local->visited)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent,(long)oldspec._4_4_);
    iVar2 = (int)sVar7;
    newop = (PcodeOp *)*ppFVar8;
    pPVar9 = FuncCallSpecs::getOp((FuncCallSpecs *)newop);
    pSVar10 = PcodeOp::getSeqNum(pPVar9);
    newspec = (FuncCallSpecs *)findOp(this,pSVar10);
    iVar2 = FuncCallSpecs::clone((FuncCallSpecs *)newop,(__fn *)newspec,__child_stack,iVar2,in_R8);
    invn0 = (Varnode *)CONCAT44(extraout_var,iVar2);
    this_00 = PcodeOp::getIn((PcodeOp *)newspec,0);
    this_01 = Varnode::getSpace(this_00);
    sVar3 = AddrSpace::getType(this_01);
    if (sVar3 == IPTR_FSPEC) {
      jiter._M_current = (JumpTable **)newVarnodeCallSpecs(this,(FuncCallSpecs *)invn0);
      opSetInput(this,(PcodeOp *)newspec,(Varnode *)jiter._M_current,0);
      deleteVarnode(this,this_00);
    }
    std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::push_back
              (&this->qlst,(value_type *)&invn0);
  }
  __gnu_cxx::
  __normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>::
  __normal_iterator(&local_a8);
  local_b0 = (JumpTable **)
             std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>::begin
                       ((vector<JumpTable_*,_std::allocator<JumpTable_*>_> *)
                        &(flow_local->visited)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_a8._M_current = local_b0;
  do {
    indop = (PcodeOp *)
            std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>::end
                      ((vector<JumpTable_*,_std::allocator<JumpTable_*>_> *)
                       &(flow_local->visited)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a8,
                       (__normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>
                        *)&indop);
    if (!bVar1) {
      FlowInfo::FlowInfo((FlowInfo *)local_280,this,&this->obank,&this->bblocks,&this->qlst,local_20
                        );
      bVar1 = FlowInfo::hasInject((FlowInfo *)local_280);
      if (bVar1) {
        FlowInfo::injectPcode((FlowInfo *)local_280);
      }
      FlowInfo::clearFlags((FlowInfo *)local_280,0xffffefff);
      FlowInfo::generateBlocks((FlowInfo *)local_280);
      this->flags = this->flags | 2;
      FlowInfo::~FlowInfo((FlowInfo *)local_280);
      return;
    }
    ppJVar11 = __gnu_cxx::
               __normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>
               ::operator*(&local_a8);
    newop_1 = JumpTable::getIndirectOp(*ppJVar11);
    if (newop_1 != (PcodeOp *)0x0) {
      pSVar10 = PcodeOp::getSeqNum(newop_1);
      local_c8 = findOp(this,pSVar10);
      if (local_c8 == (PcodeOp *)0x0) {
        jtclone._6_1_ = 1;
        pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_e8,"Could not trace jumptable across partial clone",
                   (allocator *)((long)&jtclone + 7));
        LowlevelError::LowlevelError(pLVar4,(string *)local_e8);
        jtclone._6_1_ = 0;
        __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      this_02 = (JumpTable *)operator_new(0xb0);
      ppJVar11 = __gnu_cxx::
                 __normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>
                 ::operator*(&local_a8);
      JumpTable::JumpTable(this_02,*ppJVar11);
      partialflow.inline_base._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_02;
      JumpTable::setIndirectOp(this_02,local_c8);
      std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>::push_back
                (&this->jumpvec,
                 (value_type *)
                 &partialflow.inline_base._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    __gnu_cxx::
    __normal_iterator<JumpTable_*const_*,_std::vector<JumpTable_*,_std::allocator<JumpTable_*>_>_>::
    operator++(&local_a8);
  } while( true );
}

Assistant:

void Funcdata::truncatedFlow(const Funcdata *fd,const FlowInfo *flow)

{
  if (!obank.empty())
    throw LowlevelError("Trying to do truncated flow on pre-existing pcode");

  list<PcodeOp *>::const_iterator oiter; // Clone the raw pcode
  for(oiter=fd->obank.beginDead();oiter!=fd->obank.endDead();++oiter)
    cloneOp(*oiter,(*oiter)->getSeqNum());
  obank.setUniqId(fd->obank.getUniqId());

  // Clone callspecs
  for(int4 i=0;i<fd->qlst.size();++i) {
    FuncCallSpecs *oldspec = fd->qlst[i];
    PcodeOp *newop = findOp(oldspec->getOp()->getSeqNum());
    FuncCallSpecs *newspec = oldspec->clone(newop);
    Varnode *invn0 = newop->getIn(0);
    if (invn0->getSpace()->getType() == IPTR_FSPEC) { // Replace embedded pointer to callspec
      Varnode *newvn0 = newVarnodeCallSpecs(newspec);
      opSetInput(newop,newvn0,0);
      deleteVarnode(invn0);
    }
    qlst.push_back(newspec);
  }

  vector<JumpTable *>::const_iterator jiter; // Clone the jumptables
  for(jiter=fd->jumpvec.begin();jiter!=fd->jumpvec.end();++jiter) {
    PcodeOp *indop = (*jiter)->getIndirectOp();
    if (indop == (PcodeOp *)0)	// If indirect op has not been linked, this is probably a jumptable override
      continue;			// that has not been reached by the flow yet, so we ignore/truncate it
    PcodeOp *newop = findOp(indop->getSeqNum());
    if (newop == (PcodeOp *)0)
      throw LowlevelError("Could not trace jumptable across partial clone");
    JumpTable *jtclone = new JumpTable(*jiter);
    jtclone->setIndirectOp(newop);
    jumpvec.push_back(jtclone);
  }

  FlowInfo partialflow(*this,obank,bblocks,qlst,flow); // Clone the flow
  if (partialflow.hasInject())
    partialflow.injectPcode();
  // Clear error reporting flags
  // Keep possible unreachable flag
  partialflow.clearFlags(~((uint4)FlowInfo::possible_unreachable));

  partialflow.generateBlocks(); // Generate basic blocks for partial flow
  flags |= blocks_generated;
}